

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::
UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
reset(UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
      *this)

{
  DescriptorSetUpdateBuilder *ptr;
  
  ptr = (this->m_data).ptr;
  if (ptr != (DescriptorSetUpdateBuilder *)0x0) {
    DefaultDeleter<vk::DescriptorSetUpdateBuilder>::operator()
              ((DefaultDeleter<vk::DescriptorSetUpdateBuilder> *)&(this->m_data).field_0x8,ptr);
    (this->m_data).ptr = (DescriptorSetUpdateBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}